

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O3

void anon_unknown.dwarf_4ac6::Test_TemplateDictionary_SetTemplateGlobalValueWithoutCopy::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  bool bVar3;
  void *pvVar4;
  undefined8 extraout_RAX;
  TemplateDictionaryPeer peer;
  char value [32];
  TemplateDictionary dict;
  UnsafeArena arena;
  TemplateDictionaryPeer local_2b8;
  void *local_2b0;
  TemplateString *local_2a8;
  size_t sStack_2a0;
  undefined1 local_298;
  undefined7 uStack_297;
  undefined8 uStack_290;
  char *local_288;
  undefined8 uStack_280;
  undefined1 local_278;
  undefined7 uStack_277;
  TemplateId TStack_270;
  TemplateString local_268;
  TemplateString local_248;
  TemplateString local_228;
  TemplateDictionary local_208 [112];
  undefined **local_198 [45];
  
  ctemplate::BaseArena::BaseArena((BaseArena *)local_198,(char *)0x0,100,false);
  local_198[0] = &PTR__BaseArena_0011dc00;
  local_268.ptr_ = "Test arena";
  local_268.length_ = 10;
  local_268.is_immutable_ = true;
  local_268.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary(local_208,&local_268,(UnsafeArena *)local_198);
  local_268.ptr_ = (char *)CONCAT26(local_268.ptr_._6_2_,0x6500000000);
  local_268.ptr_ = (char *)CONCAT44(local_268.ptr_._4_4_,0x756c6176);
  local_2b8.dict_ = local_208;
  local_2b0 = ctemplate::BaseArena::GetMemory((BaseArena *)local_198,0,1);
  local_288 = "key";
  uStack_280 = 3;
  local_278 = 1;
  TStack_270 = 0;
  local_2a8 = &local_268;
  sStack_2a0 = strlen((char *)&local_268);
  local_298 = &local_268 < (TemplateString *)&data_start &&
              (TemplateString *)&UNK_00109bbf < &local_268;
  uStack_290 = 0;
  TVar2._17_7_ = uStack_297;
  TVar2.is_immutable_ = (bool)local_298;
  TVar1._17_7_ = uStack_277;
  TVar1.is_immutable_ = (bool)local_278;
  TVar1.length_ = uStack_280;
  TVar1.ptr_ = local_288;
  TVar1.id_ = TStack_270;
  TVar2.length_ = sStack_2a0;
  TVar2.ptr_ = (char *)local_2a8;
  TVar2.id_ = 0;
  ctemplate::TemplateDictionary::SetTemplateGlobalValueWithoutCopy(TVar1,TVar2);
  pvVar4 = ctemplate::BaseArena::GetMemory((BaseArena *)local_198,0,1);
  if (local_2b0 == pvVar4) {
    local_228.ptr_ = "key";
    local_228.length_ = 3;
    local_228.is_immutable_ = true;
    local_228.id_ = 0;
    local_248.ptr_ = "value";
    local_248.length_ = 5;
    local_248.is_immutable_ = true;
    local_248.id_ = 0;
    bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2b8,&local_228,&local_248);
    if (bVar3) {
      local_268.ptr_ = (char *)0x756c61765f746f6e;
      local_268.length_ = CONCAT62(local_268.length_._2_6_,0x65);
      local_228.ptr_ = "key";
      local_228.length_ = 3;
      local_228.is_immutable_ = true;
      local_228.id_ = 0;
      local_248.ptr_ = "not_v";
      local_248.length_ = 5;
      local_248.is_immutable_ = true;
      local_248.id_ = 0;
      bVar3 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_2b8,&local_228,&local_248);
      if (bVar3) {
        ctemplate::TemplateDictionary::~TemplateDictionary(local_208);
        ctemplate::BaseArena::~BaseArena((BaseArena *)local_198);
        return;
      }
      goto LAB_0010fb33;
    }
  }
  else {
    _GLOBAL__N_1::Test_TemplateDictionary_SetTemplateGlobalValueWithoutCopy::Run();
  }
  _GLOBAL__N_1::Test_TemplateDictionary_SetTemplateGlobalValueWithoutCopy::Run();
LAB_0010fb33:
  _GLOBAL__N_1::Test_TemplateDictionary_SetTemplateGlobalValueWithoutCopy::Run();
  ctemplate::TemplateDictionary::~TemplateDictionary(local_208);
  ctemplate::BaseArena::~BaseArena((BaseArena *)local_198);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateDictionary, SetTemplateGlobalValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);
  TemplateDictionaryPeer peer(&dict);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetTemplateGlobalValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // "not_v" size == value" size
}